

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

void __thiscall VmaJsonWriter::EndObject(VmaJsonWriter *this)

{
  VmaVector<char,_VmaStlAllocator<char>_> *this_00;
  size_t sVar1;
  
  WriteIndent(this,true);
  this_00 = &this->m_SB->m_Data;
  sVar1 = this_00->m_Count;
  VmaVector<char,_VmaStlAllocator<char>_>::resize(this_00,sVar1 + 1);
  this_00->m_pArray[sVar1] = '}';
  VmaVector<VmaJsonWriter::StackItem,_VmaStlAllocator<VmaJsonWriter::StackItem>_>::resize
            (&this->m_Stack,(this->m_Stack).m_Count - 1);
  return;
}

Assistant:

void VmaJsonWriter::EndObject()
{
    VMA_ASSERT(!m_InsideString);

    WriteIndent(true);
    m_SB.Add('}');

    VMA_ASSERT(!m_Stack.empty() && m_Stack.back().type == COLLECTION_TYPE_OBJECT);
    m_Stack.pop_back();
}